

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_Delete(cJSON *c)

{
  cJSON *pcVar1;
  cJSON *next;
  cJSON *c_local;
  
  next = c;
  while (next != (cJSON *)0x0) {
    pcVar1 = next->next;
    if (((next->type & 0x100U) == 0) && (next->child != (cJSON *)0x0)) {
      cJSON_Delete(next->child);
    }
    if (((next->type & 0x100U) == 0) && (next->valuestring != (char *)0x0)) {
      (*cJSON_free)(next->valuestring);
    }
    if (next->string != (char *)0x0) {
      (*cJSON_free)(next->string);
    }
    (*cJSON_free)(next);
    next = pcVar1;
  }
  return;
}

Assistant:

void
cJSON_Delete(cJSON *c)
{
    cJSON *next;
    while (c) {
        next = c->next;
        if (!(c->type & cJSON_IsReference) && c->child)
            cJSON_Delete(c->child);
        if (!(c->type & cJSON_IsReference) && c->valuestring)
            cJSON_free(c->valuestring);
        if (c->string)
            cJSON_free(c->string);
        cJSON_free(c);
        c = next;
    }
}